

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O2

int CVodeB(void *cvode_mem,sunrealtype tBout,int itaskB)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  double *pdVar5;
  double dVar6;
  double *pdVar7;
  undefined8 *puVar8;
  void *cvode_mem_00;
  undefined1 auVar9 [16];
  byte bVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  double dVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  undefined4 in_register_00000034;
  undefined8 uVar19;
  char *msgfmt;
  long lVar20;
  ulong uVar21;
  double *pdVar22;
  double dVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  double dVar27;
  double local_48;
  undefined8 local_40;
  sunrealtype tBret;
  
  uVar19 = CONCAT44(in_register_00000034,itaskB);
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar12 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    iVar11 = 0x565;
    goto LAB_0010ffde;
  }
  if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    iVar12 = -0x65;
    iVar11 = 0x570;
    goto LAB_0010ffde;
  }
  pdVar5 = *(double **)((long)cvode_mem + 0xa70);
  if (*(int *)(pdVar5 + 7) == 0) {
    msgfmt = "No backward problems have been defined yet.";
    iVar12 = -0x67;
    iVar11 = 0x57a;
    goto LAB_0010ffde;
  }
  if (*(int *)(pdVar5 + 2) != 0) {
    msgfmt = "Illegal attempt to call before calling CVodeF.";
    iVar12 = -0x66;
    iVar11 = 0x584;
    goto LAB_0010ffde;
  }
  dVar14 = *pdVar5;
  dVar1 = pdVar5[1];
  dVar6 = pdVar5[6];
  dVar27 = (double)(int)((uint)(dVar14 < dVar1) * 2 + -1);
  dVar26 = dVar6;
  if (*(int *)(pdVar5 + 9) != 0) {
    for (; dVar26 != 0.0; dVar26 = *(double *)((long)dVar26 + 0x78)) {
      dVar23 = *(double *)(*(long *)((long)dVar26 + 0x10) + 0x408);
      if (((dVar23 - dVar14) * dVar27 < 0.0) || ((dVar1 - dVar23) * dVar27 < 0.0)) {
        msgfmt = 
        "The initial time tB0 for problem %d is outside the interval over which the forward problem was solved."
        ;
        iVar12 = -0x68;
        iVar11 = 0x59b;
        goto LAB_0010ffde;
      }
      if ((dVar23 - tBout) * dVar27 <= 0.0) {
        msgfmt = 
        "The final time tBout is outside the interval over which the forward problem was solved.";
        iVar12 = -0x16;
        iVar11 = 0x5a3;
        goto LAB_0010ffde;
      }
      if ((*(int *)((long)dVar26 + 0x18) != 0) || (*(int *)((long)dVar26 + 0x1c) != 0)) {
        *(undefined4 *)((long)pdVar5 + 0xbc) = 1;
      }
    }
    if ((*(int *)((long)pdVar5 + 0xbc) != 0) && (*(int *)(pdVar5 + 0x17) == 0)) {
      msgfmt = 
      "At least one backward problem requires sensitivities, but they were not stored for interpolation."
      ;
      iVar12 = -0x16;
      iVar11 = 0x5b3;
      goto LAB_0010ffde;
    }
    *(undefined4 *)(pdVar5 + 9) = 0;
  }
  if (itaskB - 3U < 0xfffffffe) {
    msgfmt = "Illegal value for itaskB. Legal values are CV_NORMAL and CV_ONE_STEP.";
    iVar12 = -0x16;
    iVar11 = 0x5c0;
    goto LAB_0010ffde;
  }
  dVar26 = tBout - dVar14;
  if (0.0 <= dVar26 * dVar27) {
    if (0.0 <= (dVar1 - tBout) * dVar27) goto LAB_001101d2;
  }
  else {
    tBout = dVar14;
    if (ABS(dVar26) < (ABS(dVar1) + ABS(dVar14)) * *(double *)((long)cvode_mem + 8) * 100.0) {
LAB_001101d2:
      dVar14 = dVar6;
      pdVar7 = (double *)pdVar5[10];
      do {
        for (; pdVar22 = pdVar7, dVar14 != 0.0; dVar14 = *(double *)((long)dVar14 + 0x78)) {
          dVar1 = *(double *)(*(long *)((long)dVar14 + 0x10) + 0x408);
          dVar26 = *pdVar22;
          if (0.0 < (dVar1 - dVar26) * dVar27) goto LAB_0011023b;
          if (itaskB == 1) {
            if (((dVar1 == dVar26) && (!NAN(dVar1) && !NAN(dVar26))) &&
               (0.0 <= (tBout - dVar26) * dVar27)) goto LAB_0011023b;
          }
          pdVar7 = pdVar22;
        }
        dVar14 = dVar6;
        pdVar7 = (double *)pdVar22[0x66];
      } while ((double *)pdVar22[0x66] != (double *)0x0);
LAB_0011023b:
      iVar12 = 0;
      while( true ) {
        dVar14 = dVar6;
        if (pdVar22 != (double *)pdVar5[0xc]) {
          pdVar7 = *(double **)((long)cvode_mem + 0xa70);
          puVar8 = (undefined8 *)pdVar7[0xf];
          local_40 = uVar19;
          if (pdVar22[0x66] == 0.0) {
            CVodeSetInitStep(cvode_mem,*(sunrealtype *)((long)cvode_mem + 0x808));
            iVar12 = CVodeReInit(cvode_mem,*pdVar22,(N_Vector)pdVar22[2]);
            if (iVar12 != 0) {
              return -0x69;
            }
            if ((*(int *)(pdVar22 + 0xf) != 0) &&
               (iVar12 = CVodeQuadReInit(cvode_mem,(N_Vector)pdVar22[0x10]), iVar12 != 0)) {
              return -0x69;
            }
            if ((*(int *)(pdVar22 + 0x1d) != 0) &&
               (iVar12 = CVodeSensReInit(cvode_mem,*(int *)((long)cvode_mem + 0x94),
                                         (N_Vector *)pdVar22[0x1e]), iVar12 != 0)) {
              return -0x69;
            }
            if ((*(int *)(pdVar22 + 0x2b) != 0) &&
               (iVar12 = CVodeQuadSensReInit(cvode_mem,(N_Vector *)pdVar22[0x2c]), iVar12 != 0)) {
              return -0x69;
            }
          }
          else {
            iVar12 = *(int *)((long)cvode_mem + 0x598);
            lVar13 = (long)iVar12;
            *(double *)((long)cvode_mem + 0x628) = pdVar22[0x3a];
            *(double *)((long)cvode_mem + 0x410) = pdVar22[0x3b];
            dVar1 = pdVar22[0x3c];
            *(double *)((long)cvode_mem + 0x3c0) = dVar1;
            *(double *)((long)cvode_mem + 0x3cc) = pdVar22[0x3d];
            *(double *)((long)cvode_mem + 0x530) = pdVar22[0x3e];
            dVar26 = pdVar22[0x40];
            *(double *)((long)cvode_mem + 0x3e0) = pdVar22[0x3f];
            *(double *)((long)cvode_mem + 1000) = dVar26;
            auVar3 = *(undefined1 (*) [16])(pdVar22 + 0x41);
            auVar9._8_4_ = auVar3._0_4_;
            auVar9._0_8_ = auVar3._8_8_;
            auVar9._12_4_ = auVar3._4_4_;
            *(undefined1 (*) [16])((long)cvode_mem + 0x3f8) = auVar9;
            *(double *)((long)cvode_mem + 0x5c8) = pdVar22[0x43];
            *(double *)((long)cvode_mem + 0x408) = *pdVar22;
            dVar26 = -NAN;
            if (-1 < SUB84(dVar1,0)) {
              dVar26 = dVar1;
            }
            *(double *)((long)cvode_mem + 0x818) = pdVar22[0x65];
            for (lVar16 = 0; (long)SUB84(dVar26,0) + 1 != lVar16; lVar16 = lVar16 + 1) {
              *(undefined8 *)(*(long *)((long)cvode_mem + 0xa50) + lVar16 * 8) = 0x3ff0000000000000;
            }
            iVar11 = N_VScaleVectorArray(SUB84(dVar1,0) + 1,*(undefined8 *)((long)cvode_mem + 0xa50)
                                         ,pdVar22 + 2);
            if (iVar11 != 0) {
              return -0x69;
            }
            if (*(int *)((long)cvode_mem + 0x3c0) < iVar12) {
              N_VScale(0,(pdVar22 + 2)[lVar13],*(undefined8 *)((long)cvode_mem + lVar13 * 8 + 0x150)
                      );
            }
            if (*(int *)(pdVar22 + 0xf) != 0) {
              iVar11 = *(int *)((long)cvode_mem + 0x3c0);
              iVar15 = -1;
              if (-1 < iVar11) {
                iVar15 = iVar11;
              }
              for (lVar16 = 0; (long)iVar15 + 1 != lVar16; lVar16 = lVar16 + 1) {
                *(undefined8 *)(*(long *)((long)cvode_mem + 0xa50) + lVar16 * 8) =
                     0x3ff0000000000000;
              }
              iVar11 = N_VScaleVectorArray(iVar11 + 1,*(undefined8 *)((long)cvode_mem + 0xa50),
                                           pdVar22 + 0x10);
              if (iVar11 != 0) {
                return -0x69;
              }
              if (*(int *)((long)cvode_mem + 0x3c0) < iVar12) {
                N_VScale(0,(pdVar22 + 0x10)[lVar13],
                         *(undefined8 *)((long)cvode_mem + lVar13 * 8 + 0x200));
              }
            }
            if (*(int *)(pdVar22 + 0x1d) != 0) {
              iVar11 = *(int *)((long)cvode_mem + 0x3c0);
              uVar4 = *(uint *)((long)cvode_mem + 0x90);
              iVar15 = 0;
              uVar17 = 0;
              if (0 < (int)uVar4) {
                uVar17 = (ulong)uVar4;
              }
              iVar18 = -1;
              if (-1 < iVar11) {
                iVar18 = iVar11;
              }
              for (lVar16 = 0; lVar16 != (long)iVar18 + 1; lVar16 = lVar16 + 1) {
                lVar20 = (long)iVar15 * 8;
                for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
                  *(undefined8 *)(*(long *)((long)cvode_mem + 0xa50) + lVar20 + uVar21 * 8) =
                       0x3ff0000000000000;
                  *(undefined8 *)(*(long *)((long)cvode_mem + 0xa58) + lVar20 + uVar21 * 8) =
                       *(undefined8 *)((long)pdVar22[lVar16 + 0x1e] + uVar21 * 8);
                  *(undefined8 *)(*(long *)((long)cvode_mem + 0xa60) + lVar20 + uVar21 * 8) =
                       *(undefined8 *)(*(long *)((long)cvode_mem + lVar16 * 8 + 0x288) + uVar21 * 8)
                  ;
                }
                iVar15 = iVar15 + uVar4;
              }
              iVar11 = N_VScaleVectorArray(uVar4 * (iVar11 + 1),
                                           *(undefined8 *)((long)cvode_mem + 0xa50),
                                           *(undefined8 *)((long)cvode_mem + 0xa58));
              if (iVar11 != 0) {
                return -0x69;
              }
              if (*(int *)((long)cvode_mem + 0x3c0) < iVar12) {
                uVar4 = *(uint *)((long)cvode_mem + 0x90);
                uVar17 = 0;
                if (0 < (int)uVar4) {
                  uVar17 = (ulong)uVar4;
                }
                lVar16 = *(long *)((long)cvode_mem + 0xa50);
                for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
                  *(undefined8 *)(lVar16 + uVar21 * 8) = 0x3ff0000000000000;
                }
                iVar11 = N_VScaleVectorArray(uVar4,lVar16,pdVar22[lVar13 + 0x1e]);
                if (iVar11 != 0) {
                  return -0x69;
                }
              }
            }
            if (*(int *)(pdVar22 + 0x2b) != 0) {
              iVar11 = *(int *)((long)cvode_mem + 0x3c0);
              uVar4 = *(uint *)((long)cvode_mem + 0x90);
              iVar15 = 0;
              uVar17 = 0;
              if (0 < (int)uVar4) {
                uVar17 = (ulong)uVar4;
              }
              iVar18 = -1;
              if (-1 < iVar11) {
                iVar18 = iVar11;
              }
              for (lVar16 = 0; lVar16 != (long)iVar18 + 1; lVar16 = lVar16 + 1) {
                lVar20 = (long)iVar15 * 8;
                for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
                  *(undefined8 *)(*(long *)((long)cvode_mem + 0xa50) + lVar20 + uVar21 * 8) =
                       0x3ff0000000000000;
                  *(undefined8 *)(*(long *)((long)cvode_mem + 0xa58) + lVar20 + uVar21 * 8) =
                       *(undefined8 *)((long)pdVar22[lVar16 + 0x2c] + uVar21 * 8);
                  *(undefined8 *)(*(long *)((long)cvode_mem + 0xa60) + lVar20 + uVar21 * 8) =
                       *(undefined8 *)(*(long *)((long)cvode_mem + lVar16 * 8 + 800) + uVar21 * 8);
                }
                iVar15 = iVar15 + uVar4;
              }
              iVar11 = N_VScaleVectorArray(uVar4 * (iVar11 + 1),
                                           *(undefined8 *)((long)cvode_mem + 0xa50),
                                           *(undefined8 *)((long)cvode_mem + 0xa58));
              if (iVar11 != 0) {
                return -0x69;
              }
              if (*(int *)((long)cvode_mem + 0x3c0) < iVar12) {
                uVar4 = *(uint *)((long)cvode_mem + 0x90);
                uVar17 = 0;
                if (0 < (int)uVar4) {
                  uVar17 = (ulong)uVar4;
                }
                lVar16 = *(long *)((long)cvode_mem + 0xa50);
                for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
                  *(undefined8 *)(lVar16 + uVar21 * 8) = 0x3ff0000000000000;
                }
                iVar12 = N_VScaleVectorArray(uVar4,lVar16,pdVar22[lVar13 + 0x2c],
                                             *(undefined8 *)((long)cvode_mem + lVar13 * 8 + 800));
                if (iVar12 != 0) {
                  return -0x69;
                }
              }
            }
            for (lVar13 = 0; lVar13 != 0xe; lVar13 = lVar13 + 1) {
              *(double *)((long)cvode_mem + lVar13 * 8 + 0x418) = pdVar22[lVar13 + 0x44];
            }
            for (lVar13 = 0; lVar13 != 6; lVar13 = lVar13 + 1) {
              *(double *)((long)cvode_mem + lVar13 * 8 + 0x488) = pdVar22[lVar13 + 0x52];
            }
            iVar12 = *(int *)((long)cvode_mem + 0x3c0);
            if (iVar12 < 0) {
              iVar12 = -1;
            }
            for (lVar13 = 0; (long)iVar12 + 1 != lVar13; lVar13 = lVar13 + 1) {
              *(double *)((long)cvode_mem + lVar13 * 8 + 0x4b8) = pdVar22[lVar13 + 0x58];
            }
            *(undefined4 *)((long)cvode_mem + 0x7f8) = 1;
          }
          *(double *)*puVar8 = *pdVar22;
          (*(code *)pdVar7[0x14])(cvode_mem);
          if (*(int *)((long)pdVar7 + 0x14) != 0) {
            CVodeSetStopTime(cvode_mem,pdVar7[3]);
          }
          dVar1 = *pdVar7;
          uVar24 = SUB84(pdVar22[1],0);
          uVar25 = (undefined4)((ulong)pdVar22[1] >> 0x20);
          dVar26 = pdVar7[1];
          dVar23 = 4.94065645841247e-324;
          do {
            iVar12 = CVode(cvode_mem,(sunrealtype)CONCAT44(uVar25,uVar24),(N_Vector)pdVar7[0x3f],
                           &local_48,2);
            if (iVar12 < 0) {
              return -0x6a;
            }
            *(double *)puVar8[(long)dVar23] = local_48;
            (*(code *)pdVar7[0x14])(cvode_mem);
            dVar23 = (double)((long)dVar23 + 1);
            dVar2 = pdVar22[1];
            uVar24 = SUB84(dVar2,0);
            uVar25 = (undefined4)((ulong)dVar2 >> 0x20);
          } while (0.0 < (double)(~-(ulong)(dVar1 < dVar26) & (ulong)-(dVar2 - local_48) |
                                 -(ulong)(dVar1 < dVar26) & (ulong)(dVar2 - local_48)));
          *(undefined4 *)((long)pdVar7 + 0xb4) = 1;
          pdVar7[0xc] = (double)pdVar22;
          pdVar7[0x10] = dVar23;
          iVar12 = 0;
          uVar19 = local_40;
        }
        for (; iVar11 = (int)uVar19, dVar14 != 0.0; dVar14 = *(double *)((long)dVar14 + 0x78)) {
          cvode_mem_00 = *(void **)((long)dVar14 + 0x10);
          dVar1 = *(double *)((long)cvode_mem_00 + 0x408);
          dVar26 = *pdVar22;
          if (((dVar1 != dVar26) || (NAN(dVar1) || NAN(dVar26))) ||
             (0.0 <= (tBout - dVar26) * dVar27)) {
            bVar10 = 0;
          }
          else {
            bVar10 = 1;
          }
          if (!(bool)((iVar11 == 2 && dVar1 == dVar26) | bVar10) && 0.0 <= (dVar1 - dVar26) * dVar27
             ) {
            pdVar5[8] = dVar14;
            CVodeSetStopTime(cvode_mem_00,dVar26);
            iVar12 = CVode(*(void **)((long)dVar14 + 0x10),tBout,*(N_Vector *)((long)dVar14 + 0x70),
                           &tBret,iVar11);
            *(sunrealtype *)((long)dVar14 + 0x68) = tBret;
            if (iVar12 < 0) goto LAB_001109e2;
          }
          else {
            *(double *)((long)dVar14 + 0x68) = dVar1;
            iVar12 = 0;
          }
        }
        if (iVar12 < 0) break;
        dVar14 = dVar6;
        if (iVar11 == 2) {
          return iVar12;
        }
        while( true ) {
          if (dVar14 == 0.0) {
            return iVar12;
          }
          if (0.0 < (*(double *)((long)dVar14 + 0x68) - tBout) * dVar27) break;
          dVar14 = *(double *)((long)dVar14 + 0x78);
        }
        pdVar22 = (double *)pdVar22[0x66];
      }
LAB_001109e2:
      msgfmt = "Error occurred while integrating backward problem # %d";
      iVar11 = 0x646;
      goto LAB_0010ffde;
    }
  }
  msgfmt = "The final time tBout is outside the interval over which the forward problem was solved."
  ;
  iVar12 = -0x16;
  iVar11 = 0x5d4;
LAB_0010ffde:
  cvProcessError((CVodeMem)cvode_mem,iVar12,iVar11,"CVodeB",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodea.c"
                 ,msgfmt);
  return iVar12;
}

Assistant:

int CVodeB(void* cvode_mem, sunrealtype tBout, int itaskB)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem, tmp_cvB_mem;
  CVckpntMem ck_mem;
  int sign, flag = 0;
  sunrealtype tfuzz, tBret, tBn;
  sunbooleantype gotCheckpoint, isActive, reachedTBout;

  /* Check if cvode_mem exists */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Was ASA initialized? */

  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check if any backward problem has been defined */

  if (ca_mem->ca_nbckpbs == 0)
  {
    cvProcessError(cv_mem, CV_NO_BCK, __LINE__, __func__, __FILE__, MSGCV_NO_BCK);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_BCK);
  }
  cvB_mem = ca_mem->cvB_mem;

  /* Check whether CVodeF has been called */

  if (ca_mem->ca_firstCVodeFcall)
  {
    cvProcessError(cv_mem, CV_NO_FWD, __LINE__, __func__, __FILE__, MSGCV_NO_FWD);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_NO_FWD);
  }
  sign = (ca_mem->ca_tfinal - ca_mem->ca_tinitial > ZERO) ? 1 : -1;

  /* If this is the first call, loop over all backward problems and
   *   - check that tB0 is valid
   *   - check that tBout is ahead of tB0 in the backward direction
   *   - check whether we need to interpolate forward sensitivities
   */

  if (ca_mem->ca_firstCVodeBcall)
  {
    tmp_cvB_mem = cvB_mem;

    while (tmp_cvB_mem != NULL)
    {
      tBn = tmp_cvB_mem->cv_mem->cv_tn;

      if ((sign * (tBn - ca_mem->ca_tinitial) < ZERO) ||
          (sign * (ca_mem->ca_tfinal - tBn) < ZERO))
      {
        cvProcessError(cv_mem, CV_BAD_TB0, __LINE__, __func__, __FILE__,
                       MSGCV_BAD_TB0, tmp_cvB_mem->cv_index);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return (CV_BAD_TB0);
      }

      if (sign * (tBn - tBout) <= ZERO)
      {
        cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                       MSGCV_BAD_TBOUT, tmp_cvB_mem->cv_index);
        SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
        return (CV_ILL_INPUT);
      }

      if (tmp_cvB_mem->cv_f_withSensi || tmp_cvB_mem->cv_fQ_withSensi)
      {
        ca_mem->ca_IMinterpSensi = SUNTRUE;
      }

      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    if (ca_mem->ca_IMinterpSensi && !ca_mem->ca_IMstoreSensi)
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_SENSI);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return (CV_ILL_INPUT);
    }

    ca_mem->ca_firstCVodeBcall = SUNFALSE;
  }

  /* Check if itaskB is legal */

  if ((itaskB != CV_NORMAL) && (itaskB != CV_ONE_STEP))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ITASKB);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Check if tBout is legal */

  if ((sign * (tBout - ca_mem->ca_tinitial) < ZERO) ||
      (sign * (ca_mem->ca_tfinal - tBout) < ZERO))
  {
    tfuzz = HUNDRED * cv_mem->cv_uround *
            (SUNRabs(ca_mem->ca_tinitial) + SUNRabs(ca_mem->ca_tfinal));
    if ((sign * (tBout - ca_mem->ca_tinitial) < ZERO) &&
        (SUNRabs(tBout - ca_mem->ca_tinitial) < tfuzz))
    {
      tBout = ca_mem->ca_tinitial;
    }
    else
    {
      cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSGCV_BAD_TBOUT);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return (CV_ILL_INPUT);
    }
  }

  /* Loop through the check points and stop as soon as a backward
   * problem has its tn value behind the current check point's t0_
   * value (in the backward direction) */

  ck_mem = ca_mem->ck_mem;

  gotCheckpoint = SUNFALSE;

  for (;;)
  {
    tmp_cvB_mem = cvB_mem;
    while (tmp_cvB_mem != NULL)
    {
      tBn = tmp_cvB_mem->cv_mem->cv_tn;

      if (sign * (tBn - ck_mem->ck_t0) > ZERO)
      {
        gotCheckpoint = SUNTRUE;
        break;
      }

      if ((itaskB == CV_NORMAL) && (tBn == ck_mem->ck_t0) &&
          (sign * (tBout - ck_mem->ck_t0) >= ZERO))
      {
        gotCheckpoint = SUNTRUE;
        break;
      }

      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    if (gotCheckpoint) { break; }

    if (ck_mem->ck_next == NULL) { break; }

    ck_mem = ck_mem->ck_next;
  }

  /* Starting with the current check point from above, loop over check points
     while propagating backward problems */

  for (;;)
  {
    /* Store interpolation data if not available.
       This is the 2nd forward integration pass */

    if (ck_mem != ca_mem->ca_ckpntData)
    {
      flag = CVAdataStore(cv_mem, ck_mem);
      if (flag != CV_SUCCESS) { break; }
    }

    /* Loop through all backward problems and, if needed,
     * propagate their solution towards tBout */

    tmp_cvB_mem = cvB_mem;
    while (tmp_cvB_mem != NULL)
    {
      /* Decide if current backward problem is "active" in this check point */

      isActive = SUNTRUE;

      tBn = tmp_cvB_mem->cv_mem->cv_tn;

      if ((tBn == ck_mem->ck_t0) && (sign * (tBout - ck_mem->ck_t0) < ZERO))
      {
        isActive = SUNFALSE;
      }
      if ((tBn == ck_mem->ck_t0) && (itaskB == CV_ONE_STEP))
      {
        isActive = SUNFALSE;
      }

      if (sign * (tBn - ck_mem->ck_t0) < ZERO) { isActive = SUNFALSE; }

      if (isActive)
      {
        /* Store the address of current backward problem memory
         * in ca_mem to be used in the wrapper functions */
        ca_mem->ca_bckpbCrt = tmp_cvB_mem;

        /* Integrate current backward problem */
        CVodeSetStopTime(tmp_cvB_mem->cv_mem, ck_mem->ck_t0);
        flag = CVode(tmp_cvB_mem->cv_mem, tBout, tmp_cvB_mem->cv_y, &tBret,
                     itaskB);

        /* Set the time at which we will report solution and/or quadratures */
        tmp_cvB_mem->cv_tout = tBret;

        /* If an error occurred, exit while loop */
        if (flag < 0) { break; }
      }
      else
      {
        flag                 = CV_SUCCESS;
        tmp_cvB_mem->cv_tout = tBn;
      }

      /* Move to next backward problem */

      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    /* If an error occurred, return now */

    if (flag < 0)
    {
      cvProcessError(cv_mem, flag, __LINE__, __func__, __FILE__,
                     MSGCV_BACK_ERROR, tmp_cvB_mem->cv_index);
      SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
      return (flag);
    }

    /* If in CV_ONE_STEP mode, return now (flag = CV_SUCCESS) */

    if (itaskB == CV_ONE_STEP) { break; }

    /* If all backward problems have successfully reached tBout, return now */

    reachedTBout = SUNTRUE;

    tmp_cvB_mem = cvB_mem;
    while (tmp_cvB_mem != NULL)
    {
      if (sign * (tmp_cvB_mem->cv_tout - tBout) > ZERO)
      {
        reachedTBout = SUNFALSE;
        break;
      }
      tmp_cvB_mem = tmp_cvB_mem->cv_next;
    }

    if (reachedTBout) { break; }

    /* Move check point in linked list to next one */

    ck_mem = ck_mem->ck_next;
  }

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (flag);
}